

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_check_flags_label(nk_context *ctx,char *label,uint flags,uint value)

{
  uint uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined8 in_RDI;
  
  nk_strlen(in_RSI);
  uVar1 = nk_check_flags_text((nk_context *)CONCAT44(in_EDX,in_ECX),in_RSI,
                              (int)((ulong)in_RDI >> 0x20),(uint)in_RDI,0);
  return uVar1;
}

Assistant:

NK_API unsigned int nk_check_flags_label(struct nk_context *ctx, const char *label,
unsigned int flags, unsigned int value)
{
return nk_check_flags_text(ctx, label, nk_strlen(label), flags, value);
}